

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UtestTest.cpp
# Opt level: O0

void StubPlatformSpecificRunTestInASeperateProcess
               (UtestShell *shell,TestPlugin *param_2,TestResult *result)

{
  SimpleString local_98;
  TestFailure local_88;
  TestResult *local_20;
  TestResult *result_local;
  TestPlugin *param_1_local;
  UtestShell *shell_local;
  
  local_20 = result;
  result_local = (TestResult *)param_2;
  param_1_local = (TestPlugin *)shell;
  SimpleString::SimpleString(&local_98,"Failed in separate process");
  TestFailure::TestFailure(&local_88,shell,&local_98);
  (*result->_vptr_TestResult[0xd])(result,&local_88);
  TestFailure::~TestFailure(&local_88);
  SimpleString::~SimpleString(&local_98);
  return;
}

Assistant:

static void StubPlatformSpecificRunTestInASeperateProcess(UtestShell* shell, TestPlugin*, TestResult* result)
{
    result->addFailure(TestFailure(shell, "Failed in separate process"));
}